

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

string * __thiscall
(anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if (*(long *)((long)this + 0x38) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    anon_unknown.dwarf_52dd::xmlEscape(&local_30,(string *)((long)this + 0x30));
    std::operator+(&local_50,"source_id=\"",&local_30);
    std::operator+(__return_storage_ptr__,&local_50,"\"");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TlbExportVisitor::emitSourceID() const
    {
        if (!m_source_id.empty())
            return "source_id=\"" + xmlEscape(m_source_id) + "\"";
        else return std::string();
    }